

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_header_decoder.c
# Opt level: O3

void free_properties(lzma_block *block,lzma_allocator *allocator)

{
  lzma_filter *plVar1;
  long lVar2;
  
  plVar1 = block->filters;
  lVar2 = 0;
  do {
    lzma_free(*(void **)((long)&plVar1->options + lVar2),allocator);
    plVar1 = block->filters;
    *(undefined8 *)((long)&plVar1->id + lVar2) = 0xffffffffffffffff;
    *(undefined8 *)((long)&plVar1->options + lVar2) = 0;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x40);
  return;
}

Assistant:

static void
free_properties(lzma_block *block, const lzma_allocator *allocator)
{
	// Free allocated filter options. The last array member is not
	// touched after the initialization in the beginning of
	// lzma_block_header_decode(), so we don't need to touch that here.
	for (size_t i = 0; i < LZMA_FILTERS_MAX; ++i) {
		lzma_free(block->filters[i].options, allocator);
		block->filters[i].id = LZMA_VLI_UNKNOWN;
		block->filters[i].options = NULL;
	}

	return;
}